

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasLazyFields
               (Descriptor *descriptor,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  MessageSCCAnalyzer *extraout_RDX;
  MessageSCCAnalyzer *pMVar2;
  MessageSCCAnalyzer *extraout_RDX_00;
  long lVar3;
  long lVar4;
  
  pMVar2 = scc_analyzer;
  if (0 < *(int *)(descriptor + 4)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = IsLazy((FieldDescriptor *)(*(long *)(descriptor + 0x28) + lVar3),options,pMVar2);
      if (bVar1) {
        return true;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x48;
      pMVar2 = extraout_RDX;
    } while (lVar4 < *(int *)(descriptor + 4));
  }
  if (0 < *(int *)(descriptor + 0x7c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = IsLazy((FieldDescriptor *)(*(long *)(descriptor + 0x50) + lVar3),options,pMVar2);
      if (bVar1) {
        return true;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x48;
      pMVar2 = extraout_RDX_00;
    } while (lVar4 < *(int *)(descriptor + 0x7c));
  }
  if (*(int *)(descriptor + 0x70) < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = HasLazyFields((Descriptor *)(*(long *)(descriptor + 0x38) + lVar3),options,
                            scc_analyzer);
      if (bVar1) {
        return bVar1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar4 < *(int *)(descriptor + 0x70));
  }
  return bVar1;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor, const Options& options,
                          MessageSCCAnalyzer* scc_analyzer) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}